

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall cmComputeLinkInformation::AddItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  size_type *psVar1;
  string *config;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t sVar4;
  pointer pcVar5;
  bool bVar6;
  bool bVar7;
  TargetType TVar8;
  int iVar9;
  const_iterator cVar10;
  cmXcFrameworkPlistLibrary *pcVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Alloc_hider _Var12;
  cmListFileBacktrace *bt;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  cmGeneratorTarget *tgt;
  string exe;
  string xcFrameworkPath;
  LinkEntry libEntry;
  cmGeneratorTarget *local_250;
  undefined1 local_248 [56];
  bool local_210;
  string local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  LinkEntry local_1a8;
  pointer local_140;
  undefined8 local_138;
  undefined1 local_130 [56];
  string local_f8;
  string local_d8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_b8;
  undefined1 local_88 [32];
  FeatureDescriptor *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  local_250 = entry->Target;
  if (local_250 == (cmGeneratorTarget *)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = cmGeneratorTarget::IsExecutableWithExports(local_250);
  }
  config = &this->Config;
  if (((bVar6 != false) && (bVar7 = cmGeneratorTarget::HasImportLibrary(local_250,config), !bVar7))
     && ((this->LoaderFlag).Value == (string *)0x0)) {
    return;
  }
  if ((local_250 == (cmGeneratorTarget *)0x0) ||
     (bVar7 = cmGeneratorTarget::IsLinkable(local_250), !bVar7)) {
    local_1a8.Item.Value._M_string_length = (size_type)(entry->Feature)._M_dataplus._M_p;
    local_1a8.Item.Value._M_dataplus._M_p = (pointer)(entry->Feature)._M_string_length;
    if ((((pointer)0x8 < local_1a8.Item.Value._M_dataplus._M_p) &&
        (__str._M_str = "FRAMEWORK", __str._M_len = 9,
        iVar9 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_1a8,
                           (size_type)(local_1a8.Item.Value._M_dataplus._M_p + -9),9,__str),
        iVar9 == 0)) ||
       ((sVar4 = (entry->Feature)._M_string_length,
        sVar4 == (anonymous_namespace)::DEFAULT_abi_cxx11_[1] &&
        (((sVar4 == 0 ||
          (iVar9 = bcmp((entry->Feature)._M_dataplus._M_p,
                        (void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,sVar4), iVar9 == 0)) &&
         ((bVar6 = cmSystemTools::IsPathToFramework((string *)entry), bVar6 &&
          (bVar6 = cmGeneratorTarget::IsApple(this->Target), bVar6)))))))) {
      AddFrameworkItem(this,entry);
      return;
    }
    local_1a8.Item.Value._M_string_length = (size_type)(entry->Feature)._M_dataplus._M_p;
    local_1a8.Item.Value._M_dataplus._M_p = (pointer)(entry->Feature)._M_string_length;
    if ((((pointer)0xa < local_1a8.Item.Value._M_dataplus._M_p) &&
        (__str_00._M_str = "XCFRAMEWORK", __str_00._M_len = 0xb,
        iVar9 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_1a8,
                           (size_type)(local_1a8.Item.Value._M_dataplus._M_p + -0xb),0xb,__str_00),
        iVar9 == 0)) ||
       ((sVar4 = (entry->Feature)._M_string_length,
        sVar4 == (anonymous_namespace)::DEFAULT_abi_cxx11_[1] &&
        ((((sVar4 == 0 ||
           (iVar9 = bcmp((entry->Feature)._M_dataplus._M_p,
                         (void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,sVar4), iVar9 == 0)) &&
          (bVar6 = cmSystemTools::IsPathToXcFramework((string *)entry), bVar6)) &&
         (bVar6 = cmGeneratorTarget::IsApple(this->Target), bVar6)))))) {
      AddXcFrameworkItem(this,entry);
      return;
    }
    bVar6 = cmsys::SystemTools::FileIsFullPath((string *)entry);
    if (!bVar6) {
      if (entry->Kind == Object) {
        return;
      }
      AddUserItem(this,entry,true);
      return;
    }
    bVar6 = cmsys::SystemTools::FileIsDirectory((string *)entry);
    if (bVar6) {
      DropDirectoryItem(this,&entry->Item);
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Depends,(value_type *)entry);
    AddFullItem(this,entry);
    AddLibraryRuntimeInfo(this,(string *)entry);
    return;
  }
  if ((bVar6 & (this->LoaderFlag).Value != (string *)0x0) == 1) {
    bVar6 = cmGeneratorTarget::HasImportLibrary(local_250,config);
    cmGeneratorTarget::GetFullPath((string *)local_248,local_250,config,(uint)bVar6,true);
    local_1c8 = &local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_248._0_8_,(pointer)(local_248._8_8_ + local_248._0_8_));
    local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
         .
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
        .
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
         TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
         TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    paVar2 = &local_1a8.Item.Value.field_2;
    if (local_1c8 == &local_1b8) {
      local_1a8.Item.Value.field_2._8_8_ = local_1b8._8_8_;
      local_1a8.Item.Value._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1a8.Item.Value._M_dataplus._M_p = (pointer)local_1c8;
    }
    local_1a8.Item.Value.field_2._M_allocated_capacity._1_7_ = local_1b8._M_allocated_capacity._1_7_
    ;
    local_1a8.Item.Value.field_2._M_local_buf[0] = local_1b8._M_local_buf[0];
    local_1a8.Item.Value._M_string_length = local_1c0;
    local_1c0 = 0;
    local_1b8._M_local_buf[0] = '\0';
    local_208._M_dataplus._M_p._0_4_ = 1;
    local_68 = (FeatureDescriptor *)0x0;
    sVar4 = (entry->Feature)._M_string_length;
    local_1c8 = &local_1b8;
    if ((sVar4 == (anonymous_namespace)::DEFAULT_abi_cxx11_[1]) &&
       ((sVar4 == 0 ||
        (iVar9 = bcmp((entry->Feature)._M_dataplus._M_p,
                      (void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,sVar4), iVar9 == 0)))) {
      local_130._0_8_ = local_130 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_130,"__CMAKE_LINK_EXECUTABLE","");
    }
    else {
      local_130._0_8_ = local_130 + 0x10;
      pcVar5 = (entry->Feature)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)local_130,pcVar5,pcVar5 + sVar4);
    }
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
             ::find(&(this->LibraryFeatureDescriptors)._M_t,(key_type *)local_130);
    local_88._0_8_ = (_Base_ptr)0x0;
    if ((_Rb_tree_header *)cVar10._M_node !=
        &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
      local_88._0_8_ = cVar10._M_node + 2;
    }
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&local_1a8.Item,(ItemIsPath *)&local_208,&local_250,&local_68,
               (FeatureDescriptor **)local_88);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
    }
    if (local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
        .
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                 .TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.Item.Value._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8.Item.Value._M_dataplus._M_p,
                      local_1a8.Item.Value.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,
                      CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1)
      ;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Depends,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
LAB_00472a25:
    _Var12._M_p = (pointer)local_248._0_8_;
    if ((undefined1 *)local_248._0_8_ == local_248 + 0x10) goto LAB_00472a40;
  }
  else {
    TVar8 = cmGeneratorTarget::GetType(local_250);
    if (TVar8 == INTERFACE_LIBRARY) {
      paVar2 = &local_1a8.Item.Value.field_2;
      local_1a8.Item.Value._M_string_length = 0;
      local_1a8.Item.Value.field_2._M_allocated_capacity =
           local_1a8.Item.Value.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
      local_1a8.Item.Value._M_dataplus._M_p = (pointer)paVar2;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1a8,(ItemIsPath *)local_248,&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8.Item.Value._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a8.Item.Value._M_dataplus._M_p,
                        local_1a8.Item.Value.field_2._M_allocated_capacity + 1);
      }
      cmGeneratorTarget::GetImportedLibName((string *)local_248,local_250,config);
      if (local_248._8_8_ != 0) {
        local_1e8 = &local_1d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,local_248._0_8_,(pointer)(local_248._8_8_ + local_248._0_8_)
                  );
        local_b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                  .TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
             TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        paVar3 = &local_b8.Value.field_2;
        if (local_1e8 == &local_1d8) {
          local_b8.Value.field_2._8_8_ = local_1d8._8_8_;
          local_b8.Value._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_b8.Value._M_dataplus._M_p = (pointer)local_1e8;
        }
        local_b8.Value.field_2._M_allocated_capacity._1_7_ = local_1d8._M_allocated_capacity._1_7_;
        local_b8.Value.field_2._M_local_buf[0] = local_1d8._M_local_buf[0];
        local_b8.Value._M_string_length = local_1e0;
        local_1e0 = 0;
        local_1d8._M_local_buf[0] = '\0';
        local_1e8 = &local_1d8;
        cmComputeLinkDepends::LinkEntry::LinkEntry(&local_1a8,&local_b8,(cmGeneratorTarget *)0x0);
        AddItem(this,&local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.Feature._M_dataplus._M_p != &local_1a8.Feature.field_2) {
          operator_delete(local_1a8.Feature._M_dataplus._M_p,
                          local_1a8.Feature.field_2._M_allocated_capacity + 1);
        }
        if (local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
            TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1a8.Item.Backtrace.
                     super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.Item.Value._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8.Item.Value._M_dataplus._M_p,
                          local_1a8.Item.Value.field_2._M_allocated_capacity + 1);
        }
        if (local_b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8.Value._M_dataplus._M_p != paVar3) {
          operator_delete(local_b8.Value._M_dataplus._M_p,
                          local_b8.Value.field_2._M_allocated_capacity + 1);
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8,
                          CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0])
                          + 1);
        }
      }
      goto LAB_00472a25;
    }
    TVar8 = cmGeneratorTarget::GetType(local_250);
    if (TVar8 == OBJECT_LIBRARY) {
      local_1a8.Item.Value._M_dataplus._M_p =
           local_1a8.Item.Value._M_dataplus._M_p & 0xffffffff00000000;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&entry->Item,(ItemIsPath *)&local_1a8,&local_250);
      goto LAB_00472a40;
    }
    iVar9 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])();
    if ((char)iVar9 == '\0') {
      bVar6 = false;
    }
    else {
      cmGeneratorTarget::GetImportedXcFrameworkPath((string *)local_88,local_250,config);
      bVar6 = local_88._8_8_ != 0;
      if ((_Base_ptr)local_88._0_8_ != (_Base_ptr)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
    }
    if (!bVar6) {
      bVar6 = cmGeneratorTarget::HasImportLibrary(local_250,config);
      cmGeneratorTarget::GetFullPath(&local_f8,local_250,config,(uint)bVar6,true);
      local_248._32_8_ =
           (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_248._40_8_ =
           (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if ((pointer)local_248._40_8_ != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          psVar1 = &(((pointer)local_248._40_8_)->LibraryIdentifier)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
          UNLOCK();
        }
        else {
          psVar1 = &(((pointer)local_248._40_8_)->LibraryIdentifier)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
        }
      }
      local_248._0_8_ = local_248 + 0x10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
        local_248._24_8_ = local_f8.field_2._8_8_;
      }
      else {
        local_248._0_8_ = local_f8._M_dataplus._M_p;
      }
      local_248._8_8_ = local_f8._M_string_length;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      bVar7 = cmGeneratorTarget::IsAIX(local_250);
      if ((bVar7) &&
         (str._M_str = (char *)local_248._0_8_, str._M_len = local_248._8_8_,
         bVar7 = cmHasLiteralSuffix<10ul>(str,(char (*) [10])0x82d6c2), bVar6 && bVar7)) {
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_248);
        return;
      }
      if ((this->LinkDependsNoShared != true) ||
         (TVar8 = cmGeneratorTarget::GetType(local_250), TVar8 != SHARED_LIBRARY)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Depends,(value_type *)local_248);
      }
      cmComputeLinkDepends::LinkEntry::LinkEntry(&local_1a8,entry);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&local_1a8.Item,
                (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_248);
      AddTargetItem(this,&local_1a8);
      bVar6 = cmGeneratorTarget::IsApple(local_250);
      if ((bVar6) && (bVar6 = cmGeneratorTarget::HasImportLibrary(local_250,config), bVar6)) {
        cmGeneratorTarget::GetFullPath
                  ((string *)local_130,local_250,config,RuntimeBinaryArtifact,true);
        AddLibraryRuntimeInfo(this,(string *)local_130,local_250);
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
          operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
        }
      }
      else {
        AddLibraryRuntimeInfo(this,(string *)local_248,local_250);
      }
      if (((local_250 != (cmGeneratorTarget *)0x0) &&
          (TVar8 = cmGeneratorTarget::GetType(local_250), TVar8 == SHARED_LIBRARY)) &&
         (bVar6 = cmGeneratorTarget::IsDLLPlatform(this->Target), bVar6)) {
        AddRuntimeDLL(this,local_250);
      }
      cmComputeLinkDepends::LinkEntry::~LinkEntry(&local_1a8);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_248);
      goto LAB_00472a40;
    }
    cmGeneratorTarget::GetImportedXcFrameworkPath((string *)&local_1a8,local_250,config);
    local_208._M_dataplus._M_p._0_4_ = 1;
    local_130._0_8_ = (pointer)0x0;
    sVar4 = (entry->Feature)._M_string_length;
    if ((sVar4 == (anonymous_namespace)::DEFAULT_abi_cxx11_[1]) &&
       ((sVar4 == 0 ||
        (iVar9 = bcmp((entry->Feature)._M_dataplus._M_p,
                      (void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,sVar4), iVar9 == 0)))) {
      local_248._0_8_ = local_248 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_248,"__CMAKE_LINK_XCFRAMEWORK","");
    }
    else {
      local_248._0_8_ = local_248 + 0x10;
      pcVar5 = (entry->Feature)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)local_248,pcVar5,pcVar5 + sVar4);
    }
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
             ::find(&(this->LibraryFeatureDescriptors)._M_t,(key_type *)local_248);
    local_68 = (FeatureDescriptor *)0x0;
    if ((_Rb_tree_header *)cVar10._M_node !=
        &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
      local_68 = (FeatureDescriptor *)(cVar10._M_node + 2);
    }
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1a8,(ItemIsPath *)&local_208,&local_250,(void **)local_130,&local_68);
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    local_248._16_8_ = local_1a8.Item.Value.field_2._M_allocated_capacity;
    _Var12._M_p = local_1a8.Item.Value._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.Item.Value._M_dataplus._M_p == &local_1a8.Item.Value.field_2)
    goto LAB_00472a40;
  }
  operator_delete(_Var12._M_p,local_248._16_8_ + 1);
LAB_00472a40:
  cmGeneratorTarget::GetImportedXcFrameworkPath(&local_208,local_250,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bt = &(entry->Item).Backtrace;
    cmParseXcFrameworkPlist((optional<cmXcFrameworkPlist> *)local_248,&local_208,this->Makefile,bt);
    if (local_210 != false) {
      pcVar11 = cmXcFrameworkPlist::SelectSuitableLibrary
                          ((cmXcFrameworkPlist *)local_248,this->Makefile,bt);
      if ((pcVar11 != (cmXcFrameworkPlistLibrary *)0x0) &&
         ((pcVar11->HeadersPath)._M_string_length != 0)) {
        local_1a8.Item.Value._M_string_length =
             CONCAT44(local_208._M_dataplus._M_p._4_4_,local_208._M_dataplus._M_p._0_4_);
        local_1a8.Item.Value._M_dataplus._M_p = (pointer)local_208._M_string_length;
        local_1a8.Item.Value.field_2._M_allocated_capacity = 0;
        local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
        .
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)(local_130 + 0x18);
        local_130._0_8_ = (pointer)0x0;
        local_130._8_8_ = 1;
        local_130[0x18] = '/';
        local_1a8.Item.Value.field_2._8_8_ = 1;
        local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
        .
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1a8.ObjectSource = (cmSourceFile *)(pcVar11->LibraryIdentifier)._M_dataplus._M_p;
        local_1a8.Target = (cmGeneratorTarget *)(pcVar11->LibraryIdentifier)._M_string_length;
        local_1a8.Kind = Library;
        local_1a8._68_4_ = 0;
        local_1a8.Feature._M_string_length = (size_type)local_50;
        local_68 = (FeatureDescriptor *)0x0;
        local_60 = &DAT_00000001;
        local_50[0] = 0x2f;
        local_1a8.Feature._M_dataplus._M_p = &DAT_00000001;
        local_1a8.Feature.field_2._M_allocated_capacity = 0;
        local_140 = (pcVar11->HeadersPath)._M_dataplus._M_p;
        local_1a8.Feature.field_2._8_8_ = (pcVar11->HeadersPath)._M_string_length;
        local_138 = 0;
        views._M_len = 5;
        views._M_array = (iterator)&local_1a8;
        local_130._16_8_ =
             local_1a8.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
             TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        local_58 = (undefined1 *)local_1a8.Feature._M_string_length;
        cmCatViews(&local_d8,views);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->XcFrameworkHeaderPaths,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_210 == true) {
        std::_Optional_payload_base<cmXcFrameworkPlist>::_M_destroy
                  ((_Optional_payload_base<cmXcFrameworkPlist> *)local_248);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_208._M_dataplus._M_p._4_4_,local_208._M_dataplus._M_p._0_4_) !=
      &local_208.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_208._M_dataplus._M_p._4_4_,local_208._M_dataplus._M_p._0_4_),
                    local_208.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(LinkEntry const& entry)
{
  cmGeneratorTarget const* tgt = entry.Target;
  BT<std::string> const& item = entry.Item;

  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !tgt->HasImportLibrary(config) && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now using a special feature.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      std::string exe = tgt->GetFullPath(config, artifact, true);
      this->Items.emplace_back(
        BT<std::string>(exe, item.Backtrace), ItemIsPath::Yes, tgt, nullptr,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_EXECUTABLE"
                                   : entry.Feature));
      this->Depends.push_back(std::move(exe));
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.emplace_back(std::string(), ItemIsPath::No, tgt);

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(BT<std::string>(libName, item.Backtrace));
      }
    } else if (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      this->Items.emplace_back(item, ItemIsPath::No, tgt);
    } else if (this->GlobalGenerator->IsXcode() &&
               !tgt->GetImportedXcFrameworkPath(config).empty()) {
      this->Items.emplace_back(
        tgt->GetImportedXcFrameworkPath(config), ItemIsPath::Yes, tgt, nullptr,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_XCFRAMEWORK"
                                   : entry.Feature));
    } else {
      // Decide whether to use an import library.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      BT<std::string> lib = BT<std::string>(
        tgt->GetFullPath(config, artifact, true), item.Backtrace);
      if (tgt->IsAIX() && cmHasLiteralSuffix(lib.Value, "-NOTFOUND") &&
          artifact == cmStateEnums::ImportLibraryArtifact) {
        // This is an imported executable on AIX that has ENABLE_EXPORTS
        // but not IMPORTED_IMPLIB.  CMake used to produce and accept such
        // imported executables on AIX before we taught it to use linker
        // import files.  For compatibility, simply skip linking to this
        // executable as we did before.  It works with runtime linking.
        return;
      }
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib.Value);
      }

      LinkEntry libEntry{ entry };
      libEntry.Item = lib;
      this->AddTargetItem(libEntry);
      if (tgt->IsApple() && tgt->HasImportLibrary(config)) {
        // Use the library rather than the tbd file for runpath computation
        this->AddLibraryRuntimeInfo(
          tgt->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact, true),
          tgt);
      } else {
        this->AddLibraryRuntimeInfo(lib.Value, tgt);
      }
      if (tgt && tgt->GetType() == cmStateEnums::SHARED_LIBRARY &&
          this->Target->IsDLLPlatform()) {
        this->AddRuntimeDLL(tgt);
      }
    }

    auto xcFrameworkPath = tgt->GetImportedXcFrameworkPath(config);
    if (!xcFrameworkPath.empty()) {
      auto plist = cmParseXcFrameworkPlist(xcFrameworkPath, *this->Makefile,
                                           item.Backtrace);
      if (!plist) {
        return;
      }
      if (auto const* library =
            plist->SelectSuitableLibrary(*this->Makefile, item.Backtrace)) {
        if (!library->HeadersPath.empty()) {
          this->AddXcFrameworkHeaderPath(cmStrCat(xcFrameworkPath, '/',
                                                  library->LibraryIdentifier,
                                                  '/', library->HeadersPath));
        }
      } else {
        return;
      }
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmHasSuffix(entry.Feature, "FRAMEWORK"_s) ||
        (entry.Feature == DEFAULT &&
         cmSystemTools::IsPathToFramework(item.Value) &&
         this->Target->IsApple())) {
      // This is a framework.
      this->AddFrameworkItem(entry);
    } else if (cmHasSuffix(entry.Feature, "XCFRAMEWORK"_s) ||
               (entry.Feature == DEFAULT &&
                cmSystemTools::IsPathToXcFramework(item.Value) &&
                this->Target->IsApple())) {
      // This is a framework.
      this->AddXcFrameworkItem(entry);
    } else if (cmSystemTools::FileIsFullPath(item.Value)) {
      if (cmSystemTools::FileIsDirectory(item.Value)) {
        // This is a directory.
        this->DropDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item.Value);
        this->AddFullItem(entry);
        this->AddLibraryRuntimeInfo(item.Value);
      }
    } else if (entry.Kind != cmComputeLinkDepends::LinkEntry::Object) {
      // This is a library or option specified by the user.
      this->AddUserItem(entry, true);
    }
  }
}